

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

void __thiscall
flatbuffers::dart::DartGenerator::GenerateStructs
          (DartGenerator *this,namespace_code_map *namespace_code)

{
  Parser *pPVar1;
  pointer ppSVar2;
  
  pPVar1 = (this->super_BaseGenerator).parser_;
  ppSVar2 = (pPVar1->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar2 !=
      (pPVar1->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      GenStruct(this,*ppSVar2,namespace_code);
      ppSVar2 = ppSVar2 + 1;
    } while (ppSVar2 !=
             (((this->super_BaseGenerator).parser_)->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenerateStructs(namespace_code_map &namespace_code) {
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      GenStruct(struct_def, namespace_code);
    }
  }